

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall
duckdb::ZSTDScanState::LoadNextPageForVector(ZSTDScanState *this,ZSTDVectorScanState *scan_state)

{
  data_ptr_t pdVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  InternalException *this_00;
  ulong uVar6;
  BufferHandle handle;
  shared_ptr<duckdb::BlockHandle,_true> block;
  string local_50;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> local_28;
  
  if ((scan_state->in_buffer).pos == (scan_state->in_buffer).size) {
    UncompressedStringSegmentState::GetHandle
              ((UncompressedStringSegmentState *)&stack0xffffffffffffffd0,
               (BlockManager *)this->state,(block_id_t)this->block_manager);
    (*this->buffer_manager->_vptr_BufferManager[7])
              (&local_50,this->buffer_manager,
               (UncompressedStringSegmentState *)&stack0xffffffffffffffd0);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid
              ((optional_ptr<duckdb::FileBuffer,_true> *)&local_50.field_2._M_allocated_capacity);
    pdVar1 = *(data_ptr_t *)(local_50.field_2._M_allocated_capacity + 0x10);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
    emplace_back<duckdb::BufferHandle>
              (&(scan_state->buffer_handles).
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
               (BufferHandle *)&local_50);
    scan_state->current_buffer_ptr = pdVar1;
    (scan_state->in_buffer).src = pdVar1;
    (scan_state->in_buffer).pos = 0;
    pBVar2 = this->block_manager;
    iVar3 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar4 = optional_idx::GetIndex(&pBVar2->block_header_size);
    uVar6 = (iVar3 - iVar4) - 8;
    uVar5 = (scan_state->metadata).compressed_size - scan_state->compressed_scan_count;
    if (uVar6 < uVar5) {
      uVar5 = uVar6;
    }
    (scan_state->in_buffer).size = uVar5;
    BufferHandle::~BufferHandle((BufferHandle *)&local_50);
    if ((__uniq_ptr_data<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true,_true>)
        local_28._M_head_impl !=
        (tuple<duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl);
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "(ZSTDScanState::LoadNextPageForVector) Trying to load the next page before consuming the current one"
             ,"");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LoadNextPageForVector(ZSTDVectorScanState &scan_state) {
		if (scan_state.in_buffer.pos != scan_state.in_buffer.size) {
			throw InternalException(
			    "(ZSTDScanState::LoadNextPageForVector) Trying to load the next page before consuming the current one");
		}
		// Read the next block id from the end of the page
		auto base_ptr =
		    reinterpret_cast<data_ptr_t>(const_cast<void *>(scan_state.in_buffer.src)); // NOLINT: const cast
		auto next_id_ptr = base_ptr + scan_state.in_buffer.size;
		block_id_t next_id = Load<block_id_t>(next_id_ptr);

		// Load the next page
		auto block = LoadPage(next_id);
		auto handle = buffer_manager.Pin(block);
		auto ptr = handle.Ptr();
		scan_state.buffer_handles.push_back(std::move(handle));
		scan_state.current_buffer_ptr = ptr;

		// Update the in_buffer to point to the new page
		scan_state.in_buffer.src = ptr;
		scan_state.in_buffer.pos = 0;

		idx_t page_size = block_manager.GetBlockSize() - sizeof(block_id_t);
		idx_t remaining_compressed_data = scan_state.metadata.compressed_size - scan_state.compressed_scan_count;
		scan_state.in_buffer.size = MinValue<idx_t>(page_size, remaining_compressed_data);
	}